

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

const_iterator __thiscall Json::Value::begin(Value *this)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  const_iterator cVar2;
  iterator local_28;
  Value *local_20;
  Value *this_local;
  bool local_10;
  
  local_20 = this;
  if ((this->field_0x8 == '\x06' || this->field_0x8 == '\a') && ((this->value_).int_ != 0)) {
    local_28 = std::
               map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
               ::begin((this->value_).map_);
    ValueConstIterator::ValueConstIterator((ValueConstIterator *)&this_local,&local_28);
    uVar1 = extraout_RDX;
  }
  else {
    ValueConstIterator::ValueConstIterator((ValueConstIterator *)&this_local);
    uVar1 = extraout_RDX_00;
  }
  cVar2.super_ValueIteratorBase._9_7_ = (undefined7)((ulong)uVar1 >> 8);
  cVar2.super_ValueIteratorBase.isNull_ = local_10;
  cVar2.super_ValueIteratorBase.current_._M_node = (_Base_ptr)this_local;
  return (const_iterator)cVar2.super_ValueIteratorBase;
}

Assistant:

Value::const_iterator Value::begin() const {
  switch (type_) {
#ifdef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
    if (value_.array_) {
      ValueInternalArray::IteratorState it;
      value_.array_->makeBeginIterator(it);
      return const_iterator(it);
    }
    break;
  case objectValue:
    if (value_.map_) {
      ValueInternalMap::IteratorState it;
      value_.map_->makeBeginIterator(it);
      return const_iterator(it);
    }
    break;
#else
  case arrayValue:
  case objectValue:
    if (value_.map_)
      return const_iterator(value_.map_->begin());
    break;
#endif
  default:
    break;
  }
  return const_iterator();
}